

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADAFWFloatOrParam.h
# Opt level: O0

void __thiscall COLLADAFW::FloatOrParam::FloatOrParam(FloatOrParam *this,float val)

{
  undefined8 *in_RDI;
  undefined4 in_XMM0_Da;
  Param *in_stack_ffffffffffffffe0;
  
  Animatable::Animatable((Animatable *)0xb325bd);
  *in_RDI = &PTR__FloatOrParam_00dbf9b0;
  *(undefined4 *)(in_RDI + 4) = in_XMM0_Da;
  *(undefined4 *)((long)in_RDI + 0x24) = 0;
  Param::Param(in_stack_ffffffffffffffe0,(ColladaType)((ulong)in_RDI >> 0x20));
  return;
}

Assistant:

FloatOrParam ( float val ) 
            : mFloatValue ( val )
            , mType ( FLOAT ) 
        {}